

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntlEngineInterfaceExtensionObject.cpp
# Opt level: O3

Var Js::IntlEngineInterfaceExtensionObject::EntryIntl_GetDefaultLocale
              (RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  BOOL BVar6;
  charcount_t cVar7;
  undefined4 *puVar8;
  char *pcVar9;
  Recycler *this;
  JavascriptString *pJVar10;
  ulong uVar11;
  char *pcVar12;
  size_t size;
  long lVar13;
  ulong uVar14;
  char16 *content;
  ulong uVar15;
  uint in_stack_00000010;
  undefined1 local_1b8 [8];
  char defaultLocaleID [157];
  undefined1 local_110 [8];
  TrackAllocData data;
  char defaultLangtag [157];
  int local_34 [2];
  UErrorCode status;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (in_stack_00000010 != callInfo._0_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x576,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00b51b48;
    *puVar8 = 0;
  }
  if ((callInfo._0_4_ >> 0x18 & 1) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x576,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) goto LAB_00b51b48;
    *puVar8 = 0;
  }
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if (((ulong)callInfo & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x576,"(argCount > 0)","Should always have implicit \'this\'");
    if (!bVar3) goto LAB_00b51b48;
    *puVar8 = 0;
  }
  local_34[0] = 0;
  memset(&data.line,0,0x9d);
  memset(local_1b8,0,0x9d);
  iVar4 = uloc_getName_70(0,local_1b8,0x9d,local_34);
  if (local_34[0] == 7) goto LAB_00b51b4a;
  if (local_34[0] < 1 && local_34[0] != -0x7c) {
    if (0x9b < iVar4 - 1U) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      pcVar12 = 
      "(localeIDActual > 0 && localeIDActual < (sizeof(*__countof_helper(defaultLocaleID)) + 0))";
      pcVar9 = 
      "localeIDActual > 0 && localeIDActual < (sizeof(*__countof_helper(defaultLocaleID)) + 0)";
      goto LAB_00b5176b;
    }
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    pcVar9 = (char *)u_errorName_70(local_34[0]);
    pcVar12 = "(false)";
LAB_00b5176b:
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x588,pcVar12,pcVar9);
    if (!bVar3) goto LAB_00b51b48;
    *puVar8 = 0;
  }
  uVar5 = uloc_toLanguageTag_70(local_1b8,&data.line,0x9d,1);
  uVar15 = (ulong)uVar5;
  if (local_34[0] == 7) {
LAB_00b51b4a:
    Throw::OutOfMemory();
  }
  if (local_34[0] < 1 && local_34[0] != -0x7c) {
    if (0x9b < uVar5 - 1) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      pcVar12 = 
      "(langtagActual > 0 && langtagActual < (sizeof(*__countof_helper(defaultLangtag)) + 0))";
      pcVar9 = 
      "langtagActual > 0 && langtagActual < (sizeof(*__countof_helper(defaultLangtag)) + 0)";
      goto LAB_00b51854;
    }
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    pcVar9 = (char *)u_errorName_70(local_34[0]);
    pcVar12 = "(false)";
LAB_00b51854:
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x58b,pcVar12,pcVar9);
    if (!bVar3) goto LAB_00b51b48;
    *puVar8 = 0;
  }
  iVar4 = uVar5 + 1;
  local_110 = (undefined1  [8])&char16_t::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_66fc5bd;
  data.filename._0_4_ = 0x58d;
  data.plusSize = (long)iVar4;
  this = Memory::Recycler::TrackAllocInfo(pSVar1->recycler,(TrackAllocData *)local_110);
  if (uVar5 == 0xffffffff) {
    Memory::Recycler::ClearTrackAllocInfo(this,(TrackAllocData *)0x0);
    content = (char16 *)&DAT_00000008;
    uVar14 = 0xffffffffffffffff;
LAB_00b518cf:
    *content = L'\0';
LAB_00b518d5:
    uVar15 = 0;
  }
  else {
    size = 0xffffffffffffffff;
    if (-1 < iVar4) {
      size = (long)iVar4 * 2;
    }
    BVar6 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar6 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                  "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar3) goto LAB_00b51b48;
      *puVar8 = 0;
    }
    content = (char16 *)
              Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)32,false>
                        (this,size);
    if (content == (char16 *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar3) goto LAB_00b51b48;
      *puVar8 = 0;
      uVar14 = (ulong)(int)uVar5;
      if ((int)uVar5 < 0) goto LAB_00b518cf;
      content = (char16 *)0x0;
      goto LAB_00b518d5;
    }
    uVar14 = (ulong)(int)uVar5;
    if ((int)uVar5 < 0) goto LAB_00b518cf;
    if (uVar5 == 0) {
      lVar13 = 0;
LAB_00b51a8b:
      if (uVar14 - lVar13 == 0) goto LAB_00b51a93;
      cVar7 = utf8::ByteIndexIntoCharacterIndex
                        ((LPCUTF8)(defaultLangtag + lVar13 + -8),uVar14 - lVar13,doDefault);
      uVar15 = (ulong)((int)lVar13 + cVar7);
      if (uVar14 < uVar15) goto LAB_00b518d5;
      utf8::DecodeUnitsIntoAndNullTerminateNoAdvance
                (content + lVar13,(LPCUTF8)(defaultLangtag + lVar13 + -8),
                 (LPCUTF8)(defaultLangtag + (uVar14 - 8)),doAllowInvalidWCHARs,(bool *)0x0);
      if (content[uVar15] != L'\0') {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar8 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Codex/Utf8Helper.h"
                                    ,0xaa,"(destString[*destCount] == 0)",
                                    "destString[*destCount] == 0");
        if (!bVar3) goto LAB_00b51b48;
        *puVar8 = 0;
      }
    }
    else {
      uVar11 = 0;
      do {
        if (defaultLangtag[uVar11 - 8] < '\x01') {
          lVar13 = 0;
          if (2 < uVar11) {
            lVar13 = uVar11 - 3;
          }
          goto LAB_00b51a8b;
        }
        content[uVar11] = (short)defaultLangtag[uVar11 - 8];
        uVar11 = uVar11 + 1;
      } while (uVar14 != uVar11);
LAB_00b51a93:
      content[uVar14] = L'\0';
    }
  }
  if (uVar14 != uVar15) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x590,
                                "(defaultLangtag16Actual == static_cast<size_t>(langtagActual))",
                                "Language tags should always be ASCII");
    if (!bVar3) {
LAB_00b51b48:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar8 = 0;
  }
  pJVar10 = JavascriptString::NewWithBuffer(content,(charcount_t)uVar15,pSVar1);
  return pJVar10;
}

Assistant:

Var IntlEngineInterfaceExtensionObject::EntryIntl_GetDefaultLocale(RecyclableObject* function, CallInfo callInfo, ...)
    {
        EngineInterfaceObject_CommonFunctionProlog(function, callInfo);

#ifdef INTL_WINGLOB
        char16 defaultLocale[LOCALE_NAME_MAX_LENGTH];
        defaultLocale[0] = '\0';

        if (GetUserDefaultLocaleName(defaultLocale, _countof(defaultLocale)) == 0)
        {
            JavascriptError::MapAndThrowError(scriptContext, HRESULT_FROM_WIN32(GetLastError()));
        }

        return JavascriptString::NewCopySz(defaultLocale, scriptContext);
#else
        UErrorCode status = U_ZERO_ERROR;
        char defaultLangtag[ULOC_FULLNAME_CAPACITY] = { 0 };
        char defaultLocaleID[ULOC_FULLNAME_CAPACITY] = { 0 };

        int localeIDActual = uloc_getName(nullptr, defaultLocaleID, _countof(defaultLocaleID), &status);
        ICU_ASSERT(status, localeIDActual > 0 && localeIDActual < _countof(defaultLocaleID));

        int langtagActual = uloc_toLanguageTag(defaultLocaleID, defaultLangtag, _countof(defaultLangtag), true, &status);
        ICU_ASSERT(status, langtagActual > 0 && langtagActual < _countof(defaultLangtag));

        char16 *defaultLangtag16 = RecyclerNewArrayLeaf(scriptContext->GetRecycler(), char16, langtagActual + 1);
        charcount_t defaultLangtag16Actual = 0;
        utf8::NarrowStringToWideNoAlloc(defaultLangtag, static_cast<size_t>(langtagActual), defaultLangtag16, langtagActual + 1, &defaultLangtag16Actual);
        AssertOrFailFastMsg(defaultLangtag16Actual == static_cast<size_t>(langtagActual), "Language tags should always be ASCII");
        return JavascriptString::NewWithBuffer(defaultLangtag16, defaultLangtag16Actual, scriptContext);
#endif
    }